

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_doing(Curl_easy *data,_Bool *dophase_done)

{
  connectdata *pcVar1;
  CURLcode CVar2;
  
  pcVar1 = data->conn;
  CVar2 = Curl_pp_statemach(data,&(pcVar1->proto).ftpc.pp,false,false);
  *dophase_done = (pcVar1->proto).pop3c.state == POP3_STOP;
  return CVar2;
}

Assistant:

static CURLcode pop3_doing(struct Curl_easy *data, bool *dophase_done)
{
  CURLcode result = pop3_multi_statemach(data, dophase_done);

  if(result)
    DEBUGF(infof(data, "DO phase failed"));
  else if(*dophase_done) {
    result = pop3_dophase_done(data, FALSE /* not connected */);

    DEBUGF(infof(data, "DO phase is complete"));
  }

  return result;
}